

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall
TTD::ThreadContextTTD::ThreadContextTTD
          (ThreadContextTTD *this,ThreadContext *threadContext,void *runtimeHandle,
          uint32 snapInterval,uint32 snapHistoryLength)

{
  Recycler *this_00;
  Recycler *pRVar1;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *ptr;
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  this->m_threadCtx = threadContext;
  this->m_runtimeHandle = runtimeHandle;
  this->m_contextCreatedOrDestoyedInReplay = false;
  this->m_activeContext = (ScriptContext *)0x0;
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       &Memory::HeapAllocator::Instance;
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_014e5c70;
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.buffer = (Type)0x0
  ;
  (this->m_contextList).
  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>.count = 0;
  (this->m_contextList).length = 0;
  (this->m_contextList).increment = 4;
  (this->m_ttdContextToExternalRefMap).buckets = (Type)0x0;
  (this->m_ttdContextToExternalRefMap).entries = (Type)0x0;
  (this->m_ttdContextToExternalRefMap).alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdContextToExternalRefMap).size = 0;
  (this->m_ttdContextToExternalRefMap).bucketCount = 0;
  (this->m_ttdContextToExternalRefMap).count = 0;
  (this->m_ttdContextToExternalRefMap).freeCount = 0;
  (this->m_ttdContextToExternalRefMap).modFunctionIndex = 0x4b;
  (this->m_ttdContextToExternalRefMap).stats = (Type)0x0;
  (this->m_ttdRootTagToObjectMap).buckets = (Type)0x0;
  (this->m_ttdRootTagToObjectMap).entries = (Type)0x0;
  (this->m_ttdRootTagToObjectMap).alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdRootTagToObjectMap).size = 0;
  (this->m_ttdRootTagToObjectMap).bucketCount = 0;
  (this->m_ttdRootTagToObjectMap).count = 0;
  (this->m_ttdRootTagToObjectMap).freeCount = 0;
  (this->m_ttdRootTagToObjectMap).modFunctionIndex = 0x4b;
  (this->m_ttdMayBeLongLivedRoot).entries = (Type)0x0;
  (this->m_ttdRootTagToObjectMap).stats = (Type)0x0;
  (this->m_ttdMayBeLongLivedRoot).buckets = (Type)0x0;
  (this->m_ttdMayBeLongLivedRoot).alloc = &Memory::HeapAllocator::Instance;
  (this->m_ttdMayBeLongLivedRoot).size = 0;
  (this->m_ttdMayBeLongLivedRoot).bucketCount = 0;
  (this->m_ttdMayBeLongLivedRoot).count = 0;
  (this->m_ttdMayBeLongLivedRoot).freeCount = 0;
  (this->m_ttdMayBeLongLivedRoot).modFunctionIndex = 0x4b;
  (this->m_ttdReplayRootPinSet).ptr =
       (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->m_ttdMayBeLongLivedRoot).stats = (Type)0x0;
  (this->m_ttdRecordRootWeakMap).ptr =
       (WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
        *)0x0;
  this->SnapInterval = snapInterval;
  this->SnapHistoryLength = snapHistoryLength;
  (this->TTDataIOInfo).pfOpenResourceStream = (TTDOpenResourceStreamCallback)0x0;
  (this->TTDataIOInfo).pfReadBytesFromStream = (TTDReadBytesFromStreamCallback)0x0;
  (this->TTDataIOInfo).pfWriteBytesToStream = (TTDWriteBytesToStreamCallback)0x0;
  (this->TTDataIOInfo).pfFlushAndCloseStream = (TTDFlushAndCloseStreamCallback)0x0;
  (this->TTDataIOInfo).ActiveTTUriLength = 0;
  (this->TTDataIOInfo).ActiveTTUri = (char *)0x0;
  (this->TTDExternalObjectFunctions).pfCreateExternalObject = (TTDCreateExternalObjectCallback)0x0;
  (this->TTDExternalObjectFunctions).pfCreateJsRTContextCallback = (TTDCreateJsRTContextCallback)0x0
  ;
  (this->TTDExternalObjectFunctions).pfReleaseJsRTContextCallback =
       (TTDReleaseJsRTContextCallback)0x0;
  (this->TTDExternalObjectFunctions).pfSetActiveJsRTContext = (TTDSetActiveJsRTContext)0x0;
  this_00 = threadContext->recycler;
  local_68 = (undefined1  [8])
             &JsUtil::
              WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_41950fe;
  data.filename._0_4_ = 0x3a;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_68);
  ptr = (WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
         *)new<Memory::Recycler>(0x50,pRVar1,0x387914);
  ptr->size = 0;
  (ptr->buckets).ptr = (int *)0x0;
  (ptr->entries).ptr = (WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *)0x0;
  ptr->count = 0;
  ptr->version = 0;
  ptr->freeList = 0;
  ptr->freeCount = 0;
  ptr->recycler = this_00;
  (ptr->entryRemovalCallback).cookie.ptr = (void *)0x0;
  ptr->lastWeakReferenceCleanupId = this_00->weakReferenceCleanupId;
  ptr->disableCleanup = false;
  ptr->modFunctionIndex = 0x4b;
  (ptr->entryRemovalCallback).fnCallback = (Type)0x0;
  Memory::
  RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
  ::Root(&this->m_ttdRecordRootWeakMap,ptr,this_00);
  local_68 = (undefined1  [8])
             &JsUtil::
              BaseHashSet<Js::RecyclableObject*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::RecyclableObject*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_41950fe;
  data.filename._0_4_ = 0x3b;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_68);
  this_01 = (BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar1,0x387914);
  JsUtil::
  BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_01,this_00,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->m_ttdReplayRootPinSet,
         (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *)this_01,this_00);
  return;
}

Assistant:

ThreadContextTTD::ThreadContextTTD(ThreadContext* threadContext, void* runtimeHandle, uint32 snapInterval, uint32 snapHistoryLength)
        : m_threadCtx(threadContext), m_runtimeHandle(runtimeHandle), m_contextCreatedOrDestoyedInReplay(false),
        SnapInterval(snapInterval), SnapHistoryLength(snapHistoryLength),
        m_activeContext(nullptr), m_contextList(&HeapAllocator::Instance), m_ttdContextToExternalRefMap(&HeapAllocator::Instance),
        m_ttdRootTagToObjectMap(&HeapAllocator::Instance), m_ttdMayBeLongLivedRoot(&HeapAllocator::Instance),
        m_ttdRecordRootWeakMap(),m_ttdReplayRootPinSet(),
        TTDataIOInfo({ 0 }), TTDExternalObjectFunctions({ 0 })
    {
        Recycler* tctxRecycler = this->m_threadCtx->GetRecycler();

        this->m_ttdRecordRootWeakMap.Root(RecyclerNew(tctxRecycler, RecordRootMap, tctxRecycler), tctxRecycler);
        this->m_ttdReplayRootPinSet.Root(RecyclerNew(tctxRecycler, ObjectPinSet, tctxRecycler), tctxRecycler);
    }